

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sbyte sVar4;
  Error EVar5;
  sbyte sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong unaff_RBX;
  uint uVar10;
  char cVar11;
  ZoneAllocator *pZVar12;
  ZoneBitVector *pZVar13;
  ZoneBitVector *this_00;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong unaff_R12;
  void *unaff_R13;
  ZoneBitVector *unaff_R14;
  void *unaff_R15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  size_t allocatedCapacity;
  uint local_4c;
  ZoneAllocator *local_40;
  ulong local_38;
  
  uVar14 = (ulong)newBitsValue;
  if (newSize <= idealCapacity) {
    unaff_RBX = (ulong)newSize;
    uVar7 = *(uint *)(this + 8);
    unaff_R12 = (ulong)uVar7;
    if (newSize <= uVar7) {
      if ((newSize & 0x3f) != 0) {
        puVar1 = (ulong *)(*(long *)this + (ulong)(newSize >> 6) * 8);
        *puVar1 = *puVar1 & ~(-1L << (sbyte)(newSize & 0x3f));
      }
      goto LAB_0012d464;
    }
    unaff_R15 = *(void **)this;
    if (newSize <= *(uint *)(this + 0xc)) goto LAB_0012d32e;
    uVar10 = idealCapacity + 0x3f & 0xffffffc0;
    unaff_R14 = this;
    if (uVar10 < newSize) goto LAB_0012d4b2;
    if (*(long *)allocator != 0) {
      local_4c = (uint)newBitsValue;
      pZVar12 = allocator;
      unaff_R13 = ZoneAllocator::_alloc(allocator,(ulong)(uVar10 >> 3),&local_38);
      pZVar13 = (ZoneBitVector *)CONCAT71((int7)((ulong)pZVar12 >> 8),unaff_R13 != (void *)0x0);
      if (unaff_R13 != (void *)0x0) {
        uVar14 = local_38 * 8;
        local_40 = allocator;
        if (uVar14 < local_38) goto LAB_0012d4be;
        goto LAB_0012d2e8;
      }
LAB_0012d31b:
      cVar11 = (char)pZVar13;
      uVar14 = (ulong)local_4c;
      goto LAB_0012d320;
    }
    pZVar13 = this;
    _resize();
LAB_0012d4be:
    uVar14 = (ulong)uVar10;
LAB_0012d2e8:
    if (0x3f < uVar7 + 0x3f) {
      uVar8 = 0;
      do {
        *(undefined8 *)((long)unaff_R13 + uVar8 * 8) = *(undefined8 *)((long)unaff_R15 + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar7 + 0x3f >> 6 != uVar8);
    }
    if (unaff_R15 == (void *)0x0) {
LAB_0012d311:
      *(void **)this = unaff_R13;
      *(int *)(this + 0xc) = (int)uVar14;
      unaff_R15 = unaff_R13;
      goto LAB_0012d31b;
    }
    this_00 = pZVar13;
    if (*(long *)local_40 != 0) {
      this_00 = (ZoneBitVector *)(ulong)*(uint *)(this + 0xc);
      if (*(uint *)(this + 0xc) < 8) goto LAB_0012d4d0;
      _resize();
      pZVar13 = (ZoneBitVector *)((ulong)pZVar13 & 0xffffffff);
      goto LAB_0012d311;
    }
LAB_0012d4cb:
    _resize();
LAB_0012d4d0:
    uVar10 = (uint)local_40;
    _resize();
    uVar7 = 0xcb;
    if (uVar10 < 0xcb) {
      uVar7 = uVar10;
    }
    EVar5 = String::_opString((String *)this_00,kAppend,
                              "None" + arm::FormatterInternal::formatFeature::sFeatureIndex[uVar7],
                              0xffffffffffffffff);
    return EVar5;
  }
  _resize();
LAB_0012d4b2:
  cVar11 = '\0';
  this = unaff_R14;
LAB_0012d320:
  if (cVar11 == '\0') {
    return 1;
  }
LAB_0012d32e:
  this_00 = (ZoneBitVector *)(unaff_R12 >> 6 & 0x3ffffff);
  uVar7 = (uint)this_00;
  newSize = (uint32_t)unaff_RBX;
  sVar4 = (sbyte)(newSize & 0x3f);
  lVar9 = -(uVar14 & 0xff);
  uVar10 = (uint)unaff_R12 & 0x3f;
  if ((unaff_R12 & 0x3f) != 0) {
    local_40 = (ZoneAllocator *)(unaff_RBX >> 6 & 0x3ffffff);
    sVar6 = 0;
    if ((uVar7 == (uint)local_40) && (sVar6 = sVar4, (newSize & 0x3f) <= uVar10)) {
      _resize();
      goto LAB_0012d4cb;
    }
    puVar1 = (ulong *)((long)unaff_R15 + (long)this_00 * 8);
    *puVar1 = *puVar1 | lVar9 << (sVar6 - (char)uVar10 & 0x3fU);
    uVar7 = uVar7 + 1;
  }
  auVar3 = _DAT_00150c20;
  auVar2 = _DAT_00150c10;
  uVar10 = newSize + 0x3f >> 6;
  if (uVar7 < uVar10) {
    uVar8 = (ulong)uVar7;
    lVar15 = (uVar10 - uVar8) + -1;
    auVar17._8_4_ = (int)lVar15;
    auVar17._0_8_ = lVar15;
    auVar17._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar16 = 0;
    auVar17 = auVar17 ^ _DAT_00150c20;
    do {
      auVar18._8_4_ = (int)uVar16;
      auVar18._0_8_ = uVar16;
      auVar18._12_4_ = (int)(uVar16 >> 0x20);
      auVar18 = (auVar18 | auVar2) ^ auVar3;
      if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                  auVar17._4_4_ < auVar18._4_4_) & 1)) {
        *(long *)((long)unaff_R15 + uVar16 * 8 + uVar8 * 8) = lVar9;
      }
      if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
          auVar18._12_4_ <= auVar17._12_4_) {
        *(long *)((long)unaff_R15 + uVar16 * 8 + uVar8 * 8 + 8) = lVar9;
      }
      uVar16 = uVar16 + 2;
    } while (((uVar10 - uVar8) + 1 & 0xfffffffffffffffe) != uVar16);
  }
  if ((unaff_RBX & 0x3f) != 0) {
    uVar8 = 0;
    if ((char)uVar14 != '\0') {
      uVar8 = ~(-1L << sVar4);
    }
    *(ulong *)((long)unaff_R15 + (ulong)(uVar10 - 1) * 8) = uVar8;
  }
LAB_0012d464:
  *(uint32_t *)(this + 8) = newSize;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}